

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_optimize.cpp
# Opt level: O3

bool __thiscall
ON_LocalZero1::BracketSpan(ON_LocalZero1 *this,double s0,double f0,double s1,double f1)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  bool bVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  double in_XMM1_Qb;
  double fp;
  double fm;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  long lStack_50;
  double local_48;
  double dVar4;
  
  if ((this->m_k != (double *)0x0) && (2 < this->m_k_count)) {
    local_68 = f0;
    dStack_60 = in_XMM1_Qb;
    local_58 = s1;
    local_48 = f1;
    uVar7 = ON_SearchMonotoneArray(this->m_k,this->m_k_count,s0);
    uVar10 = 0;
    if (0 < (int)uVar7) {
      uVar10 = (ulong)uVar7;
    }
    uVar8 = ON_SearchMonotoneArray(this->m_k,this->m_k_count,local_58);
    uVar7 = this->m_k_count - 1;
    if (this->m_k_count <= (int)uVar8) {
      uVar8 = uVar7;
    }
    uVar16 = (ulong)uVar8;
    pdVar9 = this->m_k;
    if (-1 < (int)uVar8) {
      uVar16 = (ulong)uVar8;
      do {
        if ((pdVar9[uVar16] != local_58) || (NAN(pdVar9[uVar16]) || NAN(local_58)))
        goto LAB_0056087a;
        bVar5 = 0 < (long)uVar16;
        uVar16 = uVar16 - 1;
      } while (bVar5);
      uVar16 = 0xffffffff;
    }
LAB_0056087a:
    uVar8 = (int)uVar10 + 1;
    if ((int)uVar8 < (int)uVar7) {
      uVar8 = uVar7;
    }
    pdVar12 = pdVar9 + uVar10 + 2;
    while (uVar13 = (int)uVar10 + 1, uVar10 = (ulong)uVar13, uVar11 = (ulong)uVar8,
          (int)uVar13 < (int)uVar7) {
      pdVar1 = pdVar12 + -1;
      dVar3 = *pdVar12;
      dVar4 = *pdVar12;
      pdVar12 = pdVar12 + 1;
      uVar11 = uVar10;
      if ((*pdVar1 != dVar4) || (NAN(*pdVar1) || NAN(dVar3))) break;
    }
    iVar14 = (int)uVar11;
    iVar15 = (int)uVar16;
    if (iVar14 <= iVar15) {
      (*this->_vptr_ON_LocalZero1[2])(pdVar9[uVar11],this,&local_70,0,0xffffffff);
      (*this->_vptr_ON_LocalZero1[2])(this->m_k[uVar11],this,&local_78,0,1);
      if (((local_68 <= 0.0) && (0.0 <= local_70)) || ((0.0 <= local_68 && (local_70 <= 0.0)))) {
        this->m_s1 = this->m_k[uVar11];
        this->m_f1 = local_70;
      }
      else {
        if ((0.0 < local_48) || (local_78 < 0.0)) {
          if (local_48 < 0.0) {
            return false;
          }
          if (0.0 < local_78) {
            return false;
          }
        }
        this->m_s0 = this->m_k[uVar11];
        this->m_f0 = local_78;
        if (iVar14 < iVar15) {
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[iVar15],this,&local_70,0,0xffffffff);
          (*this->_vptr_ON_LocalZero1[2])(this->m_k[iVar15],this,&local_78,0,1);
          if (((local_48 <= 0.0) && (0.0 <= local_78)) || ((0.0 <= local_48 && (local_78 <= 0.0))))
          {
            this->m_s0 = this->m_k[iVar15];
            this->m_f0 = local_78;
          }
          else {
            if ((local_70 < 0.0 || 0.0 < local_68) && (local_68 < 0.0 || 0.0 < local_70)) {
              return false;
            }
            pdVar9 = this->m_k;
            this->m_s1 = pdVar9[iVar15];
            this->m_f1 = local_70;
            if (iVar14 + 1 < iVar15) {
              local_58 = (double)-(ulong)(0.0 <= local_68);
              lStack_50 = -(ulong)(0.0 <= dStack_60);
              local_68 = (double)-(ulong)(local_68 <= 0.0);
              dStack_60 = (double)-(ulong)(dStack_60 <= 0.0);
              do {
                uVar7 = (int)uVar16 + (int)uVar11 >> 1;
                lVar17 = (long)(int)uVar7;
                (*this->_vptr_ON_LocalZero1[2])(pdVar9[lVar17],this,&local_70,0,0xffffffff);
                (*this->_vptr_ON_LocalZero1[2])(this->m_k[lVar17],this,&local_78,0,1);
                if (((-(ulong)(0.0 <= local_70) & (ulong)local_68 & 1) == 0) &&
                   ((-(ulong)(local_70 <= 0.0) & (ulong)local_58 & 1) == 0)) {
                  if ((local_78 < 0.0 || 0.0 < local_48) && (0.0 < local_78 || local_48 < 0.0)) {
                    return false;
                  }
                  pdVar9 = this->m_k;
                  this->m_s0 = pdVar9[lVar17];
                  this->m_f0 = local_78;
                  uVar10 = (long)this->m_k_count - 2;
                  uVar11 = (ulong)uVar7;
                  if ((int)uVar7 <= (int)uVar10) {
                    uVar11 = uVar10 & 0xffffffff;
                  }
                  do {
                    if ((long)uVar10 <= lVar17) goto LAB_00560bdf;
                    pdVar12 = pdVar9 + lVar17;
                    lVar2 = lVar17 + 1;
                    lVar6 = lVar17 + 1;
                  } while ((*pdVar12 == pdVar9[lVar6]) &&
                          (lVar17 = lVar2, !NAN(*pdVar12) && !NAN(pdVar9[lVar6])));
                  uVar11 = (ulong)((int)lVar2 - 1);
                }
                else {
                  pdVar9 = this->m_k;
                  this->m_s1 = pdVar9[lVar17];
                  this->m_f1 = local_70;
                  if ((int)uVar7 < 1) {
                    uVar16 = (ulong)uVar7;
                  }
                  else {
                    uVar16 = (ulong)uVar7;
                    do {
                      if ((pdVar9[uVar16 - 1] != pdVar9[uVar16]) ||
                         (NAN(pdVar9[uVar16 - 1]) || NAN(pdVar9[uVar16]))) goto LAB_00560bdf;
                      bVar5 = 1 < (long)uVar16;
                      uVar16 = uVar16 - 1;
                    } while (bVar5);
                    uVar16 = 0;
                  }
                }
LAB_00560bdf:
              } while ((int)uVar11 + 1 < (int)uVar16);
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool
ON_LocalZero1::BracketSpan( double s0, double f0, double s1, double f1 )
{
  int i0, i1, i;
  double fm, fp;
  bool rc = true;
  if ( m_k && m_k_count >= 3 ) {
    i0 = ON_SearchMonotoneArray(m_k,m_k_count,s0);
    if ( i0 < 0 )
      i0 = 0;
    i1 = ON_SearchMonotoneArray(m_k,m_k_count,s1);
    if ( i1 >= m_k_count )
      i1 = m_k_count-1;
    while ( i1 >= 0 && s1 == m_k[i1] ) {
      i1--;
    }
    i0++;
    while ( i0 < m_k_count-1 && m_k[i0] == m_k[i0+1] )
      i0++;
    if ( i0 <= i1 ) {
      // we have s0 < m_k[i0] <= ... <= m_k[i1] < s1
      Evaluate( m_k[i0], &fm, nullptr,-1 ); // guard against C0 discontinuities
      Evaluate( m_k[i0], &fp, nullptr, 1 );
      if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
        m_s1 = m_k[i0];
        m_f1 = fm;
      }
      else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
        m_s0 = m_k[i0];
        m_f0 = fp;
        if ( i0 < i1 ) {
          Evaluate( m_k[i1], &fm, nullptr, -1 );
          Evaluate( m_k[i1], &fp, nullptr,  1 );
          if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
            m_s0 = m_k[i1];
            m_f0 = fp;
          }
          else if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
            m_s1 = m_k[i1];
            m_f1 = fm;
            // we have s0 = m_k[i0] < m_k[i1] = s1 and a bonafide sign change
            while (i0+1 < i1) {
              // bisect m_k[i0],...,m_k[i1] until we get a sign change between
              // m_k[i],m_k[i+1].  We need to do this in order to make sure
              // we are passing a C2 function to the repeated zero finders.
              i = (i0+i1)>>1;
              Evaluate( m_k[i], &fm, nullptr, -1 );
              Evaluate( m_k[i], &fp, nullptr,  1 );
              if ( (f0 <= 0.0 && fm >= 0.0) || (f0 >= 0.0 && fm <= 0.0) ) {
                m_s1 = m_k[i];
                m_f1 = fm;
                i1 = i;
                while ( i1>0 && m_k[i1-1]==m_k[i1])
                  i1--;
              }
              else if ( (f1 <= 0.0 && fp >= 0.0) || (f1 >= 0.0 && fp <= 0.0) ) {
                m_s0 = m_k[i];
                m_f0 = fp;
                i0 = i;
                while ( i0 < m_k_count-2 && m_k[i0] == m_k[i0+1] )
                  i0++;
              }
              else {
                // discontinuous sign change across m_k[i]
                rc = false;
                break;
              }
            }
          }
          else {
            // discontinuous sign change across m_k[i1]
            rc = false;
          }
        }
      }
      else {
        // discontinuous sign change across m_k[i0]
        rc = false;
      }
    }
  }
  return rc;
}